

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

uint64_t __thiscall
poplar::
compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::find_child(compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *this,uint64_t node_id,uint64_t symb)

{
  uint32_t uVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t cnt;
  uint64_t rhs;
  uint64_t slot_id;
  
  uVar5 = 0xffffffffffffffff;
  if (this->size_ != 0) {
    uVar3 = bijective_hash::split_mix_hasher::hash
                      (&this->hasher_,
                       node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb);
    uVar1 = (this->capa_size_).bits_;
    slot_id = uVar3 & (this->capa_size_).mask_;
    rhs = 1;
    while ((slot_id == 0 ||
           ((bVar2 = compare_dsp_(this,slot_id,0), uVar5 = 0xffffffffffffffff, !bVar2 &&
            ((bVar2 = compare_dsp_(this,slot_id,rhs), !bVar2 ||
             (uVar4 = get_quo_(this,slot_id), uVar5 = slot_id,
             uVar3 >> ((ulong)(byte)uVar1 & 0x3f) != uVar4))))))) {
      slot_id = slot_id + 1 & (this->capa_size_).mask_;
      rhs = rhs + 1;
    }
  }
  return uVar5;
}

Assistant:

uint64_t find_child(uint64_t node_id, uint64_t symb) const {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        if (size_ == 0) {
            return nil_id;
        }

        auto [quo, mod] = decompose_(hasher_.hash(make_key_(node_id, symb)));

        for (uint64_t i = mod, cnt = 1;; i = right_(i), ++cnt) {
            if (i == get_root()) {
                // because the root's dsp value is zero though it is defined
                continue;
            }

            if (compare_dsp_(i, 0)) {
                // this slot is empty
                return nil_id;
            }

            if (compare_dsp_(i, cnt) and quo == get_quo_(i)) {
                return i;
            }
        }
    }